

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Widget::~Widget(Widget *this)

{
  QWidget::~QWidget((QWidget *)&this[-1].field_0x20);
  operator_delete(&this[-1].field_0x20,0x30);
  return;
}

Assistant:

Q_OBJECT

public:
	Widget()
		:	edit( 0 )
	{
		QHBoxLayout * l = new QHBoxLayout( this );

		edit = new QLineEdit( this );
		edit->setReadOnly( true );

		l->addWidget( edit );

		QtMWidgets::Stepper * s = new QtMWidgets::Stepper( this );

		s->setWrapping( true );

		edit->setText( QString::number( s->value() ) );

		l->addWidget( s );

		connect( s, &QtMWidgets::Stepper::valueChanged,
			this, &Widget::valueChanged );
	}